

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O1

ArrayPtr<capnp::word> __thiscall
capnp::SchemaLoader::Impl::makeUncheckedNodeEnforcingSizeRequirements(Impl *this,Reader node)

{
  size_t amount;
  ushort uVar1;
  bool bVar2;
  size_t sVar3;
  ushort uVar4;
  StructReader *this_00;
  Reader *unaff_R15;
  ArrayPtr<capnp::word> AVar5;
  MessageSizeCounts MVar6;
  ArrayPtr<capnp::word> AVar7;
  StructReader local_68;
  
  if ((0x6f < node._reader.dataSize) && (*(short *)((long)node._reader.data + 0xc) == 1)) {
    this_00 = &local_68;
    kj::
    Table<kj::HashMap<unsigned_long,capnp::SchemaLoader::Impl::RequiredSize>::Entry,kj::HashIndex<kj::HashMap<unsigned_long,capnp::SchemaLoader::Impl::RequiredSize>::Callbacks>>
    ::find<0ul,unsigned_long&>
              ((Table<kj::HashMap<unsigned_long,capnp::SchemaLoader::Impl::RequiredSize>::Entry,kj::HashIndex<kj::HashMap<unsigned_long,capnp::SchemaLoader::Impl::RequiredSize>::Callbacks>>
                *)this_00,(unsigned_long *)&this->structSizeRequirements);
    bVar2 = true;
    if (local_68.segment != (SegmentReader *)0x0) {
      if (node._reader.dataSize < 0x80) {
        uVar4 = 0;
      }
      else {
        uVar4 = *(ushort *)((long)node._reader.data + 0xe);
      }
      uVar1 = (ushort)((local_68.segment)->id).value;
      if (uVar1 <= uVar4) {
        if (node._reader.dataSize < 0xd0) {
          uVar4 = 0;
        }
        else {
          uVar4 = *(ushort *)((long)node._reader.data + 0x18);
        }
        if (*(ushort *)((long)&((local_68.segment)->id).value + 2) <= uVar4) goto LAB_00179307;
      }
      AVar5 = rewriteStructNodeWithSizes
                        (this,node,(uint)uVar1,
                         (uint)*(ushort *)((long)&((local_68.segment)->id).value + 2));
      this_00 = (StructReader *)AVar5.size_;
      unaff_R15 = (Reader *)AVar5.ptr;
      bVar2 = false;
    }
LAB_00179307:
    if (!bVar2) goto LAB_00179378;
  }
  local_68._32_8_ = node._reader._32_8_;
  local_68.nestingLimit = node._reader.nestingLimit;
  local_68._44_4_ = node._reader._44_4_;
  local_68.data = node._reader.data;
  local_68.pointers = node._reader.pointers;
  local_68.segment = node._reader.segment;
  local_68.capTable = node._reader.capTable;
  MVar6 = capnp::_::StructReader::totalSize(&local_68);
  amount = MVar6.wordCount * 8 + 8;
  this_00 = (StructReader *)(MVar6.wordCount + 1);
  sVar3 = 0;
  unaff_R15 = (Reader *)kj::Arena::allocateBytes(&this->arena,amount,8,false);
  memset(unaff_R15,0,amount);
  AVar5.size_ = sVar3;
  AVar5.ptr = (word *)this_00;
  copyToUnchecked<capnp::schema::Node::Reader&>((capnp *)&local_68,unaff_R15,AVar5);
LAB_00179378:
  AVar7.size_ = (size_t)this_00;
  AVar7.ptr = (word *)unaff_R15;
  return AVar7;
}

Assistant:

kj::ArrayPtr<word> SchemaLoader::Impl::makeUncheckedNodeEnforcingSizeRequirements(
    schema::Node::Reader node) {
  if (node.isStruct()) {
    KJ_IF_SOME(requirement, structSizeRequirements.find(node.getId())) {
      auto structNode = node.getStruct();
      if (structNode.getDataWordCount() < requirement.dataWordCount ||
          structNode.getPointerCount() < requirement.pointerCount) {
        return rewriteStructNodeWithSizes(node, requirement.dataWordCount,
                                          requirement.pointerCount);
      }
    }
  }

  return makeUncheckedNode(node);
}